

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 6522Implementation.hpp
# Opt level: O0

void __thiscall
MOS::MOS6522::MOS6522<Commodore::C1540::DriveVIA>::do_phase1
          (MOS6522<Commodore::C1540::DriveVIA> *this)

{
  DriveVIA *this_00;
  bool bVar1;
  ShiftMode SVar2;
  HalfCycles duration;
  MOS6522<Commodore::C1540::DriveVIA> *this_local;
  
  WrappedInt<HalfCycles>::operator++
            (&(this->time_since_bus_handler_call_).super_WrappedInt<HalfCycles>);
  if ((((this->super_MOS6522Storage).registers_.timer[1] == 0xffff) &&
      ((this->super_MOS6522Storage).registers_.last_timer[1] == 0)) &&
     (((this->super_MOS6522Storage).timer_is_running_[1] & 1U) != 0)) {
    (this->super_MOS6522Storage).timer_is_running_[1] = false;
    SVar2 = MOS6522Storage::shift_mode(&this->super_MOS6522Storage);
    if (SVar2 == InUnderT2) {
      shift_in(this);
    }
    else if (SVar2 == OutUnderT2FreeRunning) {
      shift_out(this);
    }
    else if (SVar2 == OutUnderT2) {
      shift_out(this);
    }
    (this->super_MOS6522Storage).registers_.interrupt_flags =
         (this->super_MOS6522Storage).registers_.interrupt_flags | 0x20;
    reevaluate_interrupts(this);
  }
  if ((((this->super_MOS6522Storage).registers_.timer[0] == 0xffff) &&
      ((this->super_MOS6522Storage).registers_.last_timer[0] == 0)) &&
     (((this->super_MOS6522Storage).timer_is_running_[0] & 1U) != 0)) {
    (this->super_MOS6522Storage).registers_.interrupt_flags =
         (this->super_MOS6522Storage).registers_.interrupt_flags | 0x40;
    reevaluate_interrupts(this);
    bVar1 = MOS6522Storage::timer1_is_continuous(&this->super_MOS6522Storage);
    if (bVar1) {
      (this->super_MOS6522Storage).registers_.timer_needs_reload = true;
    }
    else {
      (this->super_MOS6522Storage).timer_is_running_[0] = false;
    }
    bVar1 = MOS6522Storage::timer1_is_controlling_pb7(&this->super_MOS6522Storage);
    if (bVar1) {
      (this->super_MOS6522Storage).registers_.timer_port_b_output =
           (this->super_MOS6522Storage).registers_.timer_port_b_output ^ 0x80;
      this_00 = this->bus_handler_;
      duration = WrappedInt<HalfCycles>::flush<HalfCycles>
                           (&(this->time_since_bus_handler_call_).super_WrappedInt<HalfCycles>);
      PortHandler::run_for((PortHandler *)this_00,duration);
      evaluate_port_b_output(this);
    }
  }
  return;
}

Assistant:

void MOS6522<T>::do_phase1() {
	++ time_since_bus_handler_call_;

	// IRQ is raised on the half cycle after overflow
	if((registers_.timer[1] == 0xffff) && !registers_.last_timer[1] && timer_is_running_[1]) {
		timer_is_running_[1] = false;

		// If the shift register is shifting according to this timer, do a shift.
		// TODO: "shift register is driven by only the low order 8 bits of timer 2"?
		switch(shift_mode()) {
			default:												break;
			case ShiftMode::InUnderT2:				shift_in();		break;
			case ShiftMode::OutUnderT2FreeRunning:	shift_out();	break;
			case ShiftMode::OutUnderT2:				shift_out();	break;	// TODO: present a clock on CB1.
		}

		registers_.interrupt_flags |= InterruptFlag::Timer2;
		reevaluate_interrupts();
	}

	if((registers_.timer[0] == 0xffff) && !registers_.last_timer[0] && timer_is_running_[0]) {
		registers_.interrupt_flags |= InterruptFlag::Timer1;
		reevaluate_interrupts();

		// Determine whether to reload.
		if(timer1_is_continuous())
			registers_.timer_needs_reload = true;
		else
			timer_is_running_[0] = false;

		// Determine whether to toggle PB7.
		if(timer1_is_controlling_pb7()) {
			registers_.timer_port_b_output ^= 0x80;
			bus_handler_.run_for(time_since_bus_handler_call_.flush<HalfCycles>());
			evaluate_port_b_output();
		}
	}
}